

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_lambda.cpp
# Opt level: O0

void use_lambda_expressions(void)

{
  time_t tVar1;
  ostream *poVar2;
  void *pvVar3;
  difference_type dVar4;
  iterator iVar5;
  iterator iVar6;
  divider local_b4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  divider local_9c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  int *local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  int local_64;
  iterator iStack_60;
  int count_13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  int local_4c;
  iterator iStack_48;
  int count_3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  allocator<int> local_21;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> numbers;
  
  std::allocator<int>::allocator(&local_21);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,0x27,&local_21);
  std::allocator<int>::~allocator(&local_21);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  iStack_48 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_20);
  std::generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int(*)()>
            (local_40,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      iStack_48._M_current,rand);
  poVar2 = std::operator<<((ostream *)&std::cout,"Sample size = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,0x27);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_58._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  iStack_60 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_20);
  dVar4 = std::
          count_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,bool(*)(int)>
                    (local_58,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                              iStack_60._M_current,d3);
  local_4c = (int)dVar4;
  poVar2 = std::operator<<((ostream *)&std::cout,"count of numbers dividable by 3: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_4c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_70._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  local_78 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_20);
  dVar4 = std::
          count_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,bool(*)(int)>
                    (local_70,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                              local_78,d13);
  local_64 = (int)dVar4;
  poVar2 = std::operator<<((ostream *)&std::cout,"count of numbers dividable by 13: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_64);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_20,0xf3c);
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_20);
  std::generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int(*)()>
            (local_80,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_88,
             rand);
  poVar2 = std::operator<<((ostream *)&std::cout,"Sample size = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,0x27);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_90._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  local_98._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_20);
  use_lambda_expressions::divider::divider(&local_9c,3);
  dVar4 = std::
          count_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,use_lambda_expressions()::divider>
                    (local_90,local_98,local_9c);
  local_4c = (int)dVar4;
  poVar2 = std::operator<<((ostream *)&std::cout,"count of numbers dividable by 3: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_4c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  local_b0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_20);
  use_lambda_expressions::divider::divider(&local_b4,0xd);
  dVar4 = std::
          count_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,use_lambda_expressions()::divider>
                    (local_a8,local_b0,local_b4);
  local_64 = (int)dVar4;
  poVar2 = std::operator<<((ostream *)&std::cout,"count of numbers dividable by 13: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_64);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_20,390000);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  iVar6 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20)
  ;
  std::generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int(*)()>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             rand);
  poVar2 = std::operator<<((ostream *)&std::cout,"Sample size = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,0x27);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  iVar6 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20)
  ;
  dVar4 = std::
          count_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,use_lambda_expressions()::__0>
                    (iVar5._M_current,iVar6._M_current);
  local_4c = (int)dVar4;
  poVar2 = std::operator<<((ostream *)&std::cout,"count of numbers dividable by 3: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_4c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  iVar6 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20)
  ;
  dVar4 = std::
          count_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,use_lambda_expressions()::__1>
                    (iVar5._M_current,iVar6._M_current);
  local_64 = (int)dVar4;
  poVar2 = std::operator<<((ostream *)&std::cout,"count of numbers dividable by 13: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_64);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void use_lambda_expressions() {
    using namespace std;

    vector<int> numbers(SIZE_1);
    //  init random seed
    srand(time(0));
    //  fill vector with randomized value
    generate(numbers.begin(), numbers.end(), rand);

//    cout << "numbers: " << numbers << endl;

    //  normal function
    cout << "Sample size = " << SIZE_1 << endl;
    int count_3 = count_if(numbers.begin(), numbers.end(), d3);
    cout << "count of numbers dividable by 3: " << count_3 << endl;

    int count_13 = count_if(numbers.begin(), numbers.end(), d13);
    cout << "count of numbers dividable by 13: " << count_13 << endl;

    numbers.resize(SIZE_2);
    generate(numbers.begin(), numbers.end(), rand);
    cout << "Sample size = " << SIZE_1 << endl;

    //  use class functor
    class divider {
    private:
        int _dv;
    public:
        divider(int v = 1): _dv(v) {};
        bool operator() (int x) {
            return x % _dv == 0;
        }
    };

    count_3 = count_if(numbers.begin(), numbers.end(), divider(3));
    cout << "count of numbers dividable by 3: " << count_3 << endl;

    count_13 = count_if(numbers.begin(), numbers.end(), divider(13));
    cout << "count of numbers dividable by 13: " << count_13 << endl;

    //  use lambda expression
    numbers.resize(SIZE_3);
    generate(numbers.begin(), numbers.end(), rand);
    cout << "Sample size = " << SIZE_1 << endl;

    count_3 = count_if(numbers.begin(), numbers.end(), [](int x){
        return x % 3 == 0;
    });
    cout << "count of numbers dividable by 3: " << count_3 << endl;

    count_13 = count_if(numbers.begin(), numbers.end(), [](int x){
        return x % 13 == 0;
    });
    cout << "count of numbers dividable by 13: " << count_13 << endl;
}